

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void check_lcps(uchar *latest,uchar *from0,lcp_t lcp0,uchar *from1,lcp_t lcp1)

{
  lcp_t lVar1;
  lcp_t lcp1_local;
  uchar *from1_local;
  lcp_t lcp0_local;
  uchar *from0_local;
  uchar *latest_local;
  
  lVar1 = lcp(latest,from0);
  if (lVar1 != lcp0) {
    __assert_fail("lcp(latest, from0) == lcp0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x629,
                  "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)"
                 );
  }
  lVar1 = lcp(latest,from1);
  if (lVar1 == lcp1) {
    return;
  }
  __assert_fail("lcp(latest, from1) == lcp1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x62a,
                "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)");
}

Assistant:

static void
check_lcps(unsigned char* latest,
           unsigned char* from0, lcp_t lcp0,
           unsigned char* from1, lcp_t lcp1)
{
	debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<"\n"
	       <<"***********************\n";
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
}